

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lyd_parser_check_keys(lyd_node *node)

{
  bool bVar1;
  ly_ctx *local_38;
  lyd_node *local_28;
  lyd_node *key;
  lysc_node *skey;
  lyd_node *node_local;
  
  key = (lyd_node *)0x0;
  if (node->schema->nodetype != 0x10) {
    __assert_fail("node->schema->nodetype == LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                  ,0x170,"LY_ERR lyd_parser_check_keys(struct lyd_node *)");
  }
  local_28 = lyd_child(node);
  while( true ) {
    key = (lyd_node *)lys_getnext((lysc_node *)key,node->schema,(lysc_module *)0x0,0);
    bVar1 = false;
    if ((lysc_node *)key != (lysc_node *)0x0) {
      bVar1 = (((lysc_node *)key)->flags & 0x100) != 0;
    }
    if (!bVar1) break;
    if ((local_28 == (lyd_node *)0x0) || (local_28->schema != (lysc_node *)key)) {
      if (node->schema == (lysc_node *)0x0) {
        local_38 = (ly_ctx *)node[2].schema;
      }
      else {
        local_38 = node->schema->module->ctx;
      }
      ly_vlog(local_38,(char *)0x0,LYVE_DATA,"List instance is missing its key \"%s\".",
              ((lysc_node *)key)->name);
      return LY_EVALID;
    }
    local_28 = local_28->next;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_parser_check_keys(struct lyd_node *node)
{
    const struct lysc_node *skey = NULL;
    const struct lyd_node *key;

    assert(node->schema->nodetype == LYS_LIST);

    key = lyd_child(node);
    while ((skey = lys_getnext(skey, node->schema, NULL, 0)) && (skey->flags & LYS_KEY)) {
        if (!key || (key->schema != skey)) {
            LOGVAL(LYD_CTX(node), LY_VCODE_NOKEY, skey->name);
            return LY_EVALID;
        }

        key = key->next;
    }

    return LY_SUCCESS;
}